

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O0

void __thiscall pg::ZLKQSolver::run(ZLKQSolver *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  uintqueue *puVar6;
  uint *puVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  _label_vertex _Var13;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_e8 [28];
  int v_1;
  int local_c8;
  _label_vertex local_c0;
  bitset local_b0;
  _label_vertex local_90;
  bitset local_80;
  _label_vertex local_60;
  int local_50;
  int v;
  undefined1 local_40 [8];
  bitset G;
  ZLKQSolver *this_local;
  
  this->iterations = 0;
  G._allocsize = (size_t)this;
  uVar4 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar4);
  this->str = piVar5;
  puVar6 = &this->Q;
  uVar4 = Solver::nodecount(&this->super_Solver);
  (this->Q).pointer = 0;
  if ((puVar6->queue != (uint *)0x0) && (puVar6->queue != (uint *)0x0)) {
    operator_delete__(puVar6->queue);
  }
  puVar7 = (uint *)operator_new__((uVar4 & 0xffffffff) << 2);
  puVar6->queue = puVar7;
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W0,sVar8);
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W1,sVar8);
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_40,sVar8);
  bitset::operator=((bitset *)local_40,(this->super_Solver).disabled);
  bitset::flip((bitset *)local_40);
  lVar9 = Solver::nodecount(&this->super_Solver);
  lVar10 = Solver::nodecount(&this->super_Solver);
  lVar11 = Solver::nodecount(&this->super_Solver);
  solve(this,(bitset *)local_40,(int)lVar9 + -1,(int)lVar10,(int)lVar11);
  if ((this->super_Solver).trace != 0) {
    for (local_50 = 0; lVar9 = (long)local_50, lVar10 = Solver::nodecount(&this->super_Solver),
        lVar9 < lVar10; local_50 = local_50 + 1) {
      bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)local_50);
      if (!bVar2) {
        poVar12 = std::operator<<((this->super_Solver).logger,"vertex ");
        _Var13 = Solver::label_vertex(&this->super_Solver,local_50);
        local_80._bitssize = (size_t)_Var13.g;
        local_80._allocsize._0_4_ = _Var13.v;
        local_60.g = (Game *)local_80._bitssize;
        local_60.v = (int)local_80._allocsize;
        poVar12 = operator<<(poVar12,&local_60);
        std::operator<<(poVar12," is solved by");
        bitset::operator[](&local_80,(size_t)&this->W0);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&local_80);
        if (bVar2) {
          std::operator<<((this->super_Solver).logger," even");
          iVar3 = Solver::owner(&this->super_Solver,local_50);
          if (iVar3 == 0) {
            std::operator<<((this->super_Solver).logger," (");
            if (this->str[local_50] == -1) {
              std::operator<<((this->super_Solver).logger,"-1");
            }
            else {
              poVar12 = (this->super_Solver).logger;
              _Var13 = Solver::label_vertex(&this->super_Solver,this->str[local_50]);
              local_b0._bitssize = (size_t)_Var13.g;
              local_b0._allocsize._0_4_ = _Var13.v;
              local_90.g = (Game *)local_b0._bitssize;
              local_90.v = (int)local_b0._allocsize;
              operator<<(poVar12,&local_90);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        bitset::operator[](&local_b0,(size_t)&this->W1);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&local_b0);
        if (bVar2) {
          std::operator<<((this->super_Solver).logger," odd");
          iVar3 = Solver::owner(&this->super_Solver,local_50);
          if (iVar3 == 1) {
            std::operator<<((this->super_Solver).logger," (");
            if (this->str[local_50] == -1) {
              std::operator<<((this->super_Solver).logger,"-1");
            }
            else {
              poVar12 = (this->super_Solver).logger;
              _Var13 = Solver::label_vertex(&this->super_Solver,this->str[local_50]);
              register0x00000000 = _Var13.g;
              local_c8 = _Var13.v;
              local_c0.g = register0x00000000;
              local_c0.v = local_c8;
              operator<<(poVar12,&local_c0);
            }
            std::operator<<((this->super_Solver).logger,")");
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
    }
  }
  for (local_e8._20_4_ = 0; lVar9 = (long)(int)local_e8._20_4_,
      lVar10 = Solver::nodecount(&this->super_Solver), lVar9 < lVar10;
      local_e8._20_4_ = local_e8._20_4_ + 1) {
    bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_e8._20_4_);
    if (!bVar2) {
      bitset::operator[]((bitset *)local_e8,(size_t)&this->W0);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_e8);
      if (bVar2) {
        Solver::solve(&this->super_Solver,local_e8._20_4_,0,this->str[(int)local_e8._20_4_]);
      }
      bitset::operator[]((bitset *)local_f8,(size_t)&this->W1);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_f8);
      if (bVar2) {
        Solver::solve(&this->super_Solver,local_e8._20_4_,1,this->str[(int)local_e8._20_4_]);
      }
    }
  }
  poVar12 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->iterations);
  poVar12 = std::operator<<(poVar12," iterations.");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  local_fc = 0;
  while( true ) {
    lVar9 = Solver::nodecount(&this->super_Solver);
    if (lVar9 <= local_fc) {
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      bitset::~bitset((bitset *)local_40);
      return;
    }
    bVar2 = bitset::operator[]((this->super_Solver).disabled,(long)local_fc);
    if (!bVar2) break;
    local_fc = local_fc + 1;
  }
  poVar12 = std::operator<<((this->super_Solver).logger,"search was incomplete!");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void
ZLKQSolver::run()
{
    iterations = 0;

    str = new int[nodecount()];

    Q.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());

    bitset G(nodecount());
    G = disabled;
    G.flip();

    solve(G, nodecount()-1, nodecount(), nodecount());

#ifndef NDEBUG
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            logger << "vertex " << label_vertex(v) << " is solved by";
            if (W0[v]) {
                logger << " even";
                if (owner(v) == 0) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            if (W1[v]) {
                logger << " odd";
                if (owner(v) == 1) {
                    logger << " (";
                    if (str[v] == -1) logger << "-1";
                    else logger << label_vertex(str[v]);
                    logger << ")";
                }
            }
            logger << std::endl;
        }
    }
#endif

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (W0[v]) Solver::solve(v, 0, str[v]);
        if (W1[v]) Solver::solve(v, 1, str[v]);
    }

    logger << "solved with " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    delete[] str;
}